

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void __thiscall AActor::SetTranslation(AActor *this,FName *trname)

{
  DWORD DVar1;
  AActor *pAVar2;
  FName local_c;
  
  local_c = (FName)trname->Index;
  if (*FName::NameData.NameArray[local_c.Index].Text == '\0') {
    pAVar2 = GetDefault(this);
    DVar1 = pAVar2->Translation;
  }
  else {
    DVar1 = R_FindCustomTranslation(&local_c);
    if ((int)DVar1 < 0) {
      return;
    }
  }
  this->Translation = DVar1;
  return;
}

Assistant:

void AActor::SetTranslation(FName trname)
{
	// There is no constant for the empty name...
	if (trname.GetChars()[0] == 0)
	{
		// an empty string resets to the default
		Translation = GetDefault()->Translation;
		return;
	}

	int tnum = R_FindCustomTranslation(trname);
	if (tnum >= 0)
	{
		Translation = tnum;
	}
	// silently ignore if the name does not exist, this would create some insane message spam otherwise.
}